

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpabortdescriptors.cpp
# Opt level: O3

int __thiscall jrtplib::RTPAbortDescriptors::ReadSignallingByte(RTPAbortDescriptors *this)

{
  int iVar1;
  uchar buf [1];
  undefined8 uStack_8;
  
  iVar1 = -0xae;
  if (this->m_init == true) {
    uStack_8 = 0xffffff52;
    read(this->m_descriptors[0],(void *)((long)&uStack_8 + 7),1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int RTPAbortDescriptors::ReadSignallingByte()
{
	if (!m_init)
		return ERR_RTP_ABORTDESC_NOTINIT;

	unsigned char buf[1];

	if (read(m_descriptors[0],buf,1))
	{
		// To get rid of __wur related compiler warnings
	}
	return 0;
}